

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher_erk.c
# Opt level: O1

char * ARKodeButcherTable_ERKIDToName(ARKODE_ERKTableID emethod)

{
  char *pcVar1;
  
  if ((uint)(emethod + ARKODE_BOGACKI_SHAMPINE_4_2_3) < 0x1a) {
    pcVar1 = &DAT_00161be8 +
             *(int *)(&DAT_00161be8 + (ulong)(uint)(emethod + ARKODE_BOGACKI_SHAMPINE_4_2_3) * 4);
  }
  else {
    pcVar1 = (char *)0x0;
    arkProcessError((ARKodeMem)0x0,-0x16,0x49,"ARKodeButcherTable_ERKIDToName",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_butcher_erk.c"
                    ,"Unknown Butcher table");
  }
  return pcVar1;
}

Assistant:

const char* ARKodeButcherTable_ERKIDToName(ARKODE_ERKTableID emethod)
{
  /* Use X-macro to test each method name */
  switch (emethod)
  {
#define ARK_BUTCHER_TABLE(name, coeff) \
  case name: return #name;
#include "arkode_butcher_erk.def"
#undef ARK_BUTCHER_TABLE

  default:
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Unknown Butcher table");
    return NULL;
  }
}